

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Sprs_array_column_distribution(int s_a,int iproc,int *lo,int *hi)

{
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  int in_ESI;
  int in_EDI;
  Integer ihi;
  Integer ilo;
  Integer ip;
  Integer sa;
  undefined4 local_38 [2];
  undefined4 local_30 [2];
  long local_28;
  long local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  
  local_20 = (long)in_EDI;
  local_28 = (long)in_ESI;
  local_18 = in_RCX;
  local_10 = in_RDX;
  pnga_sprs_array_column_distribution(local_20,local_28,(Integer *)local_30,(Integer *)local_38);
  *local_10 = local_30[0];
  *local_18 = local_38[0];
  return;
}

Assistant:

void NGA_Sprs_array_column_distribution(int s_a, int iproc, int *lo, int *hi)
{
  Integer sa = (Integer)s_a;
  Integer ip = (Integer)iproc;
  Integer ilo, ihi;
  wnga_sprs_array_column_distribution(sa,ip,&ilo,&ihi);
  *lo = (int)ilo;
  *hi = (int)ihi;
}